

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O0

void __thiscall
glslang::TPoolAllocator::TPoolAllocator
          (TPoolAllocator *this,int growthIncrement,int allocationAlignment)

{
  ulong local_28;
  size_t a;
  size_t minAlign;
  int allocationAlignment_local;
  int growthIncrement_local;
  TPoolAllocator *this_local;
  
  this->pageSize = (long)growthIncrement;
  this->alignment = (long)allocationAlignment;
  this->freeList = (tHeader *)0x0;
  this->inUseList = (tHeader *)0x0;
  std::
  vector<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
  ::vector(&this->stack);
  this->numCalls = 0;
  if (this->pageSize < 0x1000) {
    this->pageSize = 0x1000;
  }
  this->currentPageOffset = this->pageSize;
  this->alignment = this->alignment & 0xfffffffffffffff8;
  if (this->alignment < 8) {
    this->alignment = 8;
  }
  for (local_28 = 1; local_28 < this->alignment; local_28 = local_28 << 1) {
  }
  this->alignment = local_28;
  this->alignmentMask = local_28 - 1;
  this->headerSkip = 8;
  if (this->headerSkip < 0x18) {
    this->headerSkip = this->alignmentMask + 0x18 & (this->alignmentMask ^ 0xffffffffffffffff);
  }
  push(this);
  return;
}

Assistant:

TPoolAllocator::TPoolAllocator(int growthIncrement, int allocationAlignment) :
    pageSize(growthIncrement),
    alignment(allocationAlignment),
    freeList(nullptr),
    inUseList(nullptr),
    numCalls(0)
{
    //
    // Don't allow page sizes we know are smaller than all common
    // OS page sizes.
    //
    if (pageSize < 4*1024)
        pageSize = 4*1024;

    //
    // A large currentPageOffset indicates a new page needs to
    // be obtained to allocate memory.
    //
    currentPageOffset = pageSize;

    //
    // Adjust alignment to be at least pointer aligned and
    // power of 2.
    //
    size_t minAlign = sizeof(void*);
    alignment &= ~(minAlign - 1);
    if (alignment < minAlign)
        alignment = minAlign;
    size_t a = 1;
    while (a < alignment)
        a <<= 1;
    alignment = a;
    alignmentMask = a - 1;

    //
    // Align header skip
    //
    headerSkip = minAlign;
    if (headerSkip < sizeof(tHeader)) {
        headerSkip = (sizeof(tHeader) + alignmentMask) & ~alignmentMask;
    }

    push();
}